

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<QTextEdit::ExtraSelection>::Inserter::insertOne
          (Inserter *this,qsizetype pos,ExtraSelection *t)

{
  ExtraSelection *pEVar1;
  ExtraSelection *pEVar2;
  undefined8 uVar3;
  undefined7 uVar4;
  QTextCursor QVar5;
  undefined7 uVar6;
  long lVar7;
  long lVar8;
  
  pEVar1 = this->begin;
  lVar8 = this->size;
  pEVar2 = pEVar1 + lVar8;
  this->end = pEVar2;
  this->last = pEVar1 + lVar8 + -1;
  this->where = pEVar1 + pos;
  lVar7 = lVar8 - pos;
  this->sourceCopyConstruct = 0;
  this->nSource = 1;
  this->move = 1 - lVar7;
  this->sourceCopyAssign = 1;
  if (0 < lVar7) {
    QTextCursor::QTextCursor(&pEVar2->cursor,&pEVar1[lVar8 + -1].cursor);
    QTextFormat::QTextFormat
              (&(pEVar2->format).super_QTextFormat,&pEVar2[-1].format.super_QTextFormat);
    this->size = this->size + 1;
    if (this->move != 0) {
      lVar7 = 8;
      lVar8 = 0;
      do {
        pEVar2 = this->last;
        uVar3 = *(undefined8 *)((long)pEVar2 + lVar7 + -8);
        *(undefined8 *)((long)pEVar2 + lVar7 + -8) = *(undefined8 *)((long)pEVar2 + lVar7 + -0x20);
        *(undefined8 *)((long)pEVar2 + lVar7 + -0x20) = uVar3;
        QTextFormat::operator=
                  ((QTextFormat *)(&pEVar2->cursor + lVar7),
                   (QTextFormat *)(&pEVar2[-1].cursor + lVar7));
        lVar8 = lVar8 + -1;
        lVar7 = lVar7 + -0x18;
      } while (lVar8 != this->move);
    }
    pEVar2 = this->where;
    QVar5 = pEVar2->cursor;
    uVar6 = *(undefined7 *)&pEVar2->field_0x1;
    uVar4 = *(undefined7 *)&t->field_0x1;
    pEVar2->cursor = t->cursor;
    *(undefined7 *)&pEVar2->field_0x1 = uVar4;
    t->cursor = QVar5;
    *(undefined7 *)&t->field_0x1 = uVar6;
    QTextFormat::operator=(&(pEVar2->format).super_QTextFormat,&(t->format).super_QTextFormat);
    return;
  }
  this->sourceCopyConstruct = 1 - lVar7;
  this->move = 0;
  this->sourceCopyAssign = lVar7;
  QTextCursor::QTextCursor(&pEVar2->cursor,&t->cursor);
  QTextFormat::QTextFormat(&(pEVar2->format).super_QTextFormat,&(t->format).super_QTextFormat);
  this->size = this->size + 1;
  return;
}

Assistant:

void insertOne(qsizetype pos, T &&t)
        {
            setup(pos, 1);

            if (sourceCopyConstruct) {
                Q_ASSERT(sourceCopyConstruct == 1);
                new (end) T(std::move(t));
                ++size;
            } else {
                // create a new element at the end by move constructing one existing element
                // inside the array.
                new (end) T(std::move(*(end - 1)));
                ++size;

                // now move assign existing elements towards the end
                for (qsizetype i = 0; i != move; --i)
                    last[i] = std::move(last[i - 1]);

                // and move the new item into place
                *where = std::move(t);
            }
        }